

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void readrle(BinarySource *bs,termline *ldata,
            _func_void_BinarySource_ptr_termchar_ptr_termline_ptr_unsigned_long_ptr *readliteral)

{
  byte bVar1;
  wchar_t wVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  wchar_t wVar6;
  long lVar7;
  unsigned_long state;
  unsigned_long local_40;
  size_t local_38;
  
  local_40 = 0;
  wVar2 = ldata->cols;
  if (wVar2 < L'\x01') {
    wVar6 = L'\0';
  }
  else {
    lVar7 = 0;
    do {
      bVar1 = BinarySource_get_byte(bs->binarysource_);
      if ((char)bVar1 < '\0') {
        local_38 = bs->pos;
        lVar7 = (long)(int)lVar7;
        lVar5 = lVar7 << 5;
        lVar4 = (ulong)bVar1 - 0x7e;
        do {
          if (ldata->cols <= lVar7) {
            __assert_fail("n < ldata->cols",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0x326,
                          "void readrle(BinarySource *, termline *, void (*)(BinarySource *, termchar *, termline *, unsigned long *))"
                         );
          }
          bs->pos = local_38;
          (*readliteral)(bs,(termchar *)((long)&ldata->chars->chr + lVar5),ldata,&local_40);
          lVar7 = lVar7 + 1;
          lVar5 = lVar5 + 0x20;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      else {
        lVar7 = (long)(int)lVar7;
        lVar4 = lVar7 << 5;
        iVar3 = bVar1 + 1;
        do {
          if (ldata->cols <= lVar7) {
            __assert_fail("n < ldata->cols",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0x330,
                          "void readrle(BinarySource *, termline *, void (*)(BinarySource *, termchar *, termline *, unsigned long *))"
                         );
          }
          (*readliteral)(bs,(termchar *)((long)&ldata->chars->chr + lVar4),ldata,&local_40);
          lVar7 = lVar7 + 1;
          lVar4 = lVar4 + 0x20;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      wVar2 = ldata->cols;
      wVar6 = (wchar_t)lVar7;
    } while (wVar6 < wVar2);
  }
  if (wVar6 != wVar2) {
    __assert_fail("n == ldata->cols",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x337,
                  "void readrle(BinarySource *, termline *, void (*)(BinarySource *, termchar *, termline *, unsigned long *))"
                 );
  }
  return;
}

Assistant:

static void readrle(BinarySource *bs, termline *ldata,
                    void (*readliteral)(BinarySource *bs, termchar *c,
                                        termline *ldata, unsigned long *state))
{
    int n = 0;
    unsigned long state = 0;

    while (n < ldata->cols) {
        int hdr = get_byte(bs);

        if (hdr >= 0x80) {
            /* A run. */

            size_t pos = bs->pos, count = hdr + 2 - 0x80;
            while (count--) {
                assert(n < ldata->cols);
                bs->pos = pos;
                readliteral(bs, ldata->chars + n, ldata, &state);
                n++;
            }
        } else {
            /* Just a sequence of consecutive literals. */

            int count = hdr + 1;
            while (count--) {
                assert(n < ldata->cols);
                readliteral(bs, ldata->chars + n, ldata, &state);
                n++;
            }
        }
    }

    assert(n == ldata->cols);
}